

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tools.cpp
# Opt level: O3

uint randomMT(void)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  time_t tVar4;
  uint i;
  long lVar5;
  int iVar6;
  
  iVar2 = next + 1;
  iVar6 = next;
  if (0x26e < next) {
    if (next == 0x26f) {
      iVar6 = 0x26f;
      iVar2 = 0;
    }
    else {
      iVar6 = 0;
      next = iVar2;
      tVar4 = time((time_t *)0x0);
      uVar3 = (int)tVar4 + 0x1571;
      lVar5 = 1;
      state[0] = uVar3;
      do {
        uVar3 = (uVar3 >> 0x1e ^ uVar3) * 0x6c078965 + (int)lVar5;
        state[lVar5] = uVar3;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 0x270);
      iVar2 = 1;
    }
  }
  iVar1 = iVar6 + 0x18d;
  if (0xe2 < iVar6) {
    iVar1 = iVar6 + -0xe3;
  }
  uVar3 = -(state[iVar2] & 1) & 0x9908b0df ^
          (state[iVar2] & 0x7ffffffe | state[iVar6] & 0x80000000) >> 1 ^ state[iVar1];
  next = iVar2;
  state[iVar6] = uVar3;
  uVar3 = uVar3 >> 0xb ^ uVar3;
  uVar3 = (uVar3 & 0x13a58ad) << 7 ^ uVar3;
  uVar3 = (uVar3 & 0x1df8c) << 0xf ^ uVar3;
  return uVar3 >> 0x12 ^ uVar3;
}

Assistant:

uint randomMT()
{
    int cur = next;
    if(++next >= N)
    {
        if(next > N) { seedMT(5489U + time(NULL)); cur = next++; }
        else next = 0;
    }
    uint y = (state[cur] & 0x80000000U) | (state[next] & 0x7FFFFFFFU);
    state[cur] = y = state[cur < N-M ? cur + M : cur + M-N] ^ (y >> 1) ^ (-int(y & 1U) & K);
    y ^= (y >> 11);
    y ^= (y <<  7) & 0x9D2C5680U;
    y ^= (y << 15) & 0xEFC60000U;
    y ^= (y >> 18);
    return y;
}